

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nicdrv.c
# Opt level: O1

int ecx_waitinframe(ecx_portt *port,int idx,int timeout)

{
  int iVar1;
  osal_timert timer;
  osal_timert local_20;
  
  osal_timer_start(&local_20,timeout);
  iVar1 = ecx_waitinframe_red(port,idx,&local_20);
  if (iVar1 < 0) {
    port->rxbufstat[idx] = 0;
    if (port->redstate != 0) {
      port->redport->rxbufstat[idx] = 0;
    }
  }
  return iVar1;
}

Assistant:

int ecx_waitinframe(ecx_portt *port, int idx, int timeout)
{
   int wkc;
   osal_timert timer;
   
   osal_timer_start (&timer, timeout); 
   wkc = ecx_waitinframe_red(port, idx, &timer);
   /* if nothing received, clear buffer index status so it can be used again */
   if (wkc <= EC_NOFRAME) 
   {
      ecx_setbufstat(port, idx, EC_BUF_EMPTY);
   }
   
   return wkc;
}